

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O2

IntVar * getConstant(int v)

{
  iterator iVar1;
  ostream *this;
  mapped_type *this_00;
  IntVar *pIVar2;
  int in_EDI;
  IntVar *var;
  stringstream ss;
  int local_1bc;
  IntVar *local_1b8;
  string local_1b0 [32];
  stringstream local_190 [16];
  ostream local_180 [376];
  
  local_1bc = in_EDI;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_IntVar_*>,_std::_Select1st<std::pair<const_int,_IntVar_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_>
          ::find(&ic_map._M_t,&local_1bc);
  if ((_Rb_tree_header *)iVar1._M_node == &ic_map._M_t._M_impl.super__Rb_tree_header) {
    local_1b8 = newIntVar(local_1bc,local_1bc);
    std::__cxx11::stringstream::stringstream(local_190);
    this = std::operator<<(local_180,"constant_");
    std::ostream::operator<<((ostream *)this,local_1bc);
    std::__cxx11::stringbuf::str();
    this_00 = std::
              map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&intVarString_abi_cxx11_,&local_1b8);
    std::__cxx11::string::operator=((string *)this_00,local_1b0);
    std::__cxx11::string::~string(local_1b0);
    IntVar::specialiseToEL(local_1b8);
    std::
    _Rb_tree<int,std::pair<int_const,IntVar*>,std::_Select1st<std::pair<int_const,IntVar*>>,std::less<int>,std::allocator<std::pair<int_const,IntVar*>>>
    ::_M_emplace_unique<int&,IntVar*&>
              ((_Rb_tree<int,std::pair<int_const,IntVar*>,std::_Select1st<std::pair<int_const,IntVar*>>,std::less<int>,std::allocator<std::pair<int_const,IntVar*>>>
                *)&ic_map,&local_1bc,&local_1b8);
    pIVar2 = local_1b8;
    std::__cxx11::stringstream::~stringstream(local_190);
  }
  else {
    pIVar2 = (IntVar *)iVar1._M_node[1]._M_parent;
  }
  return pIVar2;
}

Assistant:

IntVar* getConstant(int v) {
	auto it = ic_map.find(v);
	if (it != ic_map.end()) {
		return it->second;
	}
	IntVar* var = newIntVar(v, v);

	std::stringstream ss;
	ss << "constant_" << v;
	intVarString[var] = ss.str();

	var->specialiseToEL();
	ic_map.emplace(v, var);

	return var;
}